

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.cpp
# Opt level: O3

void * P33xThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  SOCKET SVar10;
  char *pcVar11;
  CHRONO chrono_period;
  P33X p33x;
  char szTemp [256];
  char szSaveFilePath [256];
  interval local_848;
  int local_830;
  int local_82c;
  double local_828;
  timespec local_820;
  double local_810;
  double dStack_808;
  double local_800;
  double dStack_7f8;
  timespec local_7f0;
  int local_7e0;
  timeval local_7d8;
  double local_7c8;
  double local_7c0;
  interval local_7b8;
  interval local_7a0;
  P33X local_788;
  char local_238 [256];
  char local_138 [264];
  
  memset(&local_788,0,0x550);
  iVar5 = clock_getres(4,&local_7f0);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_820), iVar5 == 0)) {
    local_7e0 = 0;
    local_810 = 0.0;
    dStack_808 = 0.0;
    local_800 = 0.0;
    dStack_7f8 = 0.0;
  }
  iVar5 = 100;
  bVar2 = false;
  local_830 = 0;
LAB_001b08ca:
  iVar8 = iVar5 / 1000;
  iVar7 = iVar5 % 1000;
  bVar2 = !bVar2;
  local_82c = iVar5;
  while( true ) {
    if (local_7e0 == 0) {
      clock_gettime(4,(timespec *)&local_848);
      local_810 = local_848.inf;
      dStack_808 = local_848.sup;
      local_848.inf =
           (double)((((long)local_848.inf + (long)local_800) - local_820.tv_sec) +
                   ((long)local_848.sup + (long)dStack_7f8) / 1000000000);
      local_848.sup =
           (double)(((long)local_848.sup + (long)dStack_7f8) % 1000000000 - local_820.tv_nsec);
      if ((long)local_848.sup < 0) {
        local_848.inf = (double)((long)local_848.inf + ~((ulong)-(long)local_848.sup / 1000000000));
        local_848.sup =
             (double)((long)local_848.sup + 1000000000 +
                     ((ulong)-(long)local_848.sup / 1000000000) * 1000000000);
      }
      local_800 = local_848.inf;
      dStack_7f8 = local_848.sup;
    }
    iVar5 = clock_getres(4,&local_7f0);
    if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_820), iVar5 == 0)) {
      local_7e0 = 0;
      local_800 = 0.0;
      dStack_7f8 = 0.0;
      local_810 = 0.0;
      dStack_808 = 0.0;
    }
    local_848.inf = (double)(long)iVar8;
    local_848.sup = (double)(long)(iVar7 * 1000000);
    nanosleep((timespec *)&local_848,(timespec *)0x0);
    iVar5 = local_82c;
    if (bPauseP33x == 0) break;
    if (!bVar2) {
      puts("P33x Paused.");
      SVar10 = local_788.RS232Port.s;
      switch(local_788.RS232Port.DevType) {
      case 0:
        SVar10 = (int)local_788.RS232Port.hDev;
        goto LAB_001b0a8a;
      case 1:
      case 3:
        break;
      case 2:
        shutdown(local_788.RS232Port.s,2);
        close(SVar10);
      case 4:
        SVar10 = local_788.RS232Port.s_srv;
        break;
      default:
        goto switchD_001b0a52_default;
      }
      shutdown(SVar10,2);
LAB_001b0a8a:
      iVar5 = close(SVar10);
      pcVar11 = "P33x disconnected.";
      if (iVar5 != 0) {
switchD_001b0a52_default:
        pcVar11 = "P33x disconnection failed.";
      }
      puts(pcVar11);
    }
    if (bExit != 0) {
      bVar3 = true;
      goto LAB_001b0f44;
    }
    local_848.inf = 0.0;
    local_848.sup = 4.94065645841247e-316;
    nanosleep((timespec *)&local_848,(timespec *)0x0);
    bVar2 = true;
  }
  if (bRestartP33x == 0) {
    if (bVar2) goto LAB_001b0d1b;
    local_848.inf = (double)((ulong)local_848.inf & 0xffffffff00000000);
    iVar8 = ReadChannelP33x(&local_788,'\x01',(float *)&local_848);
    if (iVar8 != 0) {
      puts("Connection to a P33x lost.");
      SVar10 = local_788.RS232Port.s;
      switch(local_788.RS232Port.DevType) {
      case 0:
        SVar10 = (int)local_788.RS232Port.hDev;
        goto LAB_001b0f12;
      case 1:
      case 3:
        break;
      case 2:
        shutdown(local_788.RS232Port.s,2);
        close(SVar10);
      case 4:
        SVar10 = local_788.RS232Port.s_srv;
        break;
      default:
        goto switchD_001b0b90_default;
      }
      shutdown(SVar10,2);
LAB_001b0f12:
      iVar8 = close(SVar10);
      pcVar11 = "P33x disconnected.";
      if (iVar8 != 0) {
switchD_001b0b90_default:
        pcVar11 = "P33x disconnection failed.";
      }
      puts(pcVar11);
      goto LAB_001b0d4e;
    }
    local_828 = (double)local_848.inf._0_4_;
    local_788.LastPressure = local_828;
    iVar8 = gettimeofday(&local_7d8,(__timezone_ptr_t)0x0);
    if (iVar8 != 0) {
      local_7d8.tv_sec = 0;
      local_7d8.tv_usec = 0;
    }
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    pressure_mes = local_828;
    local_7c0 = ((local_828 - local_788.PressureRef) * -100000.0) /
                (local_788.WaterDensity * 9.80665);
    interval::interval(&local_7a0,&local_7c0);
    local_7c8 = -z_pressure_acc;
    interval::interval(&local_7b8,&local_7c8,&z_pressure_acc);
    operator+(&local_7a0,&local_7b8);
    interval::operator=((interval *)&z_pressure,&local_848);
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    if (local_788.bSaveRawData != 0) {
      fprintf((FILE *)local_788.pfSaveFile,"%d;%d;%f;\n",SUB84(local_828,0),
              local_7d8.tv_sec & 0xffffffff,local_7d8.tv_usec & 0xffffffff);
      goto LAB_001b0eb8;
    }
  }
  else {
    if (!bVar2) {
      puts("Restarting a P33x.");
      SVar10 = local_788.RS232Port.s;
      switch(local_788.RS232Port.DevType) {
      case 0:
        iVar8 = (int)local_788.RS232Port.hDev;
        goto LAB_001b0cf0;
      case 1:
      case 3:
        iVar8 = local_788.RS232Port.s;
        break;
      case 2:
        shutdown(local_788.RS232Port.s,2);
        close(SVar10);
      case 4:
        iVar8 = local_788.RS232Port.s_srv;
        break;
      default:
        goto switchD_001b0b26_default;
      }
      shutdown(iVar8,2);
LAB_001b0cf0:
      iVar8 = close(iVar8);
      pcVar11 = "P33x disconnected.";
      if (iVar8 != 0) {
switchD_001b0b26_default:
        pcVar11 = "P33x disconnection failed.";
      }
      puts(pcVar11);
    }
    bRestartP33x = 0;
LAB_001b0d1b:
    iVar7 = ConnectP33x(&local_788,"P33x0.txt");
    iVar8 = local_788.threadperiod;
    if (iVar7 != 0) {
      local_848.inf = 4.94065645841247e-324;
      local_848.sup = 0.0;
      nanosleep((timespec *)&local_848,(timespec *)0x0);
LAB_001b0d4e:
      local_830 = local_830 + 1;
      if (ExitOnErrorCount <= local_830 && 0 < ExitOnErrorCount) {
        bExit = 1;
        bVar3 = true;
        goto LAB_001b0f44;
      }
      bVar2 = false;
      bVar3 = true;
      goto LAB_001b0ecc;
    }
    if ((FILE *)local_788.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)local_788.pfSaveFile);
      local_788.pfSaveFile = (FILE *)0x0;
    }
    iVar5 = iVar8;
    if (local_788.bSaveRawData == 0) goto LAB_001b0ec5;
    if (local_788.szCfgFilePath[0] == '\0') {
      builtin_strncpy(local_238,"p33x",5);
    }
    else {
      sprintf(local_238,"%.127s",local_788.szCfgFilePath);
    }
    sVar6 = strlen(local_238);
    iVar8 = (int)sVar6 + 1;
    uVar9 = sVar6 & 0xffffffff;
    do {
      if ((int)uVar9 < 1) goto LAB_001b0e3f;
      uVar1 = uVar9 - 1;
      iVar8 = iVar8 + -1;
      lVar4 = uVar9 - 1;
      uVar9 = uVar1;
    } while (local_238[lVar4] != '.');
    if ((uVar1 != 0) && (iVar8 <= (int)sVar6)) {
      memset(local_238 + (uVar1 & 0xffffffff),0,sVar6 - (uVar1 & 0xffffffff));
    }
LAB_001b0e3f:
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar11 = strtimeex_fns();
    sprintf(local_138,"log/%.127s_%.64s.csv",local_238,pcVar11);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    local_788.pfSaveFile = (FILE *)fopen(local_138,"w");
    if ((FILE *)local_788.pfSaveFile == (FILE *)0x0) {
      puts("Unable to create P33x data file.");
      bVar3 = false;
      goto LAB_001b0f44;
    }
    fwrite("tv_sec;tv_usec;pressure;\n",0x19,1,(FILE *)local_788.pfSaveFile);
LAB_001b0eb8:
    fflush((FILE *)local_788.pfSaveFile);
  }
LAB_001b0ec5:
  bVar2 = true;
  bVar3 = false;
LAB_001b0ecc:
  if (bExit != 0) goto LAB_001b0f44;
  goto LAB_001b08ca;
LAB_001b0f44:
  if (local_7e0 == 0) {
    clock_gettime(4,(timespec *)&local_848);
    local_810 = local_848.inf;
    dStack_808 = local_848.sup;
    local_848.inf =
         (double)((((long)local_848.inf + (long)local_800) - local_820.tv_sec) +
                 ((long)local_848.sup + (long)dStack_7f8) / 1000000000);
    local_848.sup =
         (double)(((long)local_848.sup + (long)dStack_7f8) % 1000000000 - local_820.tv_nsec);
    if ((long)local_848.sup < 0) {
      local_848.inf = (double)((long)local_848.inf + ~((ulong)-(long)local_848.sup / 1000000000));
      local_848.sup =
           (double)((long)local_848.sup + 1000000000 +
                   ((ulong)-(long)local_848.sup / 1000000000) * 1000000000);
    }
    local_800 = local_848.inf;
    dStack_7f8 = local_848.sup;
  }
  if ((FILE *)local_788.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_788.pfSaveFile);
    local_788.pfSaveFile = (FILE *)0x0;
  }
  if (bVar3) goto LAB_001b109a;
  switch(local_788.RS232Port.DevType) {
  case 0:
    goto LAB_001b107a;
  case 1:
  case 3:
    SVar10 = local_788.RS232Port.s;
    break;
  case 2:
    shutdown(local_788.RS232Port.s,2);
    close(local_788.RS232Port.s);
  case 4:
    SVar10 = local_788.RS232Port.s_srv;
    break;
  default:
    goto switchD_001b1042_default;
  }
  shutdown(SVar10,2);
  local_788.RS232Port.hDev._0_4_ = SVar10;
LAB_001b107a:
  iVar5 = close((int)local_788.RS232Port.hDev);
  if (iVar5 == 0) {
    pcVar11 = "P33x disconnected.";
  }
  else {
switchD_001b1042_default:
    pcVar11 = "P33x disconnection failed.";
  }
  puts(pcVar11);
LAB_001b109a:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE P33xThread(void* pParam)
{
	P33X p33x;
	struct timeval tv;
	double pressure = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&p33x, 0, sizeof(P33X));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseP33x)
		{
			if (bConnected)
			{
				printf("P33x Paused.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartP33x)
		{
			if (bConnected)
			{
				printf("Restarting a P33x.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}
			bRestartP33x = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectP33x(&p33x, "P33x0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = p33x.threadperiod;

				if (p33x.pfSaveFile != NULL)
				{
					fclose(p33x.pfSaveFile); 
					p33x.pfSaveFile = NULL;
				}
				if ((p33x.bSaveRawData)&&(p33x.pfSaveFile == NULL)) 
				{
					if (strlen(p33x.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", p33x.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "p33x");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					p33x.pfSaveFile = fopen(szSaveFilePath, "w");
					if (p33x.pfSaveFile == NULL) 
					{
						printf("Unable to create P33x data file.\n");
						break;
					}
					fprintf(p33x.pfSaveFile, "tv_sec;tv_usec;pressure;\n"); 
					fflush(p33x.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetPressureP33x(&p33x, &pressure) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = pressure;
				z_pressure = Pressure2Height(pressure, p33x.PressureRef, p33x.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);

				if (p33x.bSaveRawData)
				{
					fprintf(p33x.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, pressure);
					fflush(p33x.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a P33x lost.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}		
		}

		//printf("P33xThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (p33x.pfSaveFile != NULL)
	{
		fclose(p33x.pfSaveFile); 
		p33x.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectP33x(&p33x);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}